

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void pnga_norm_infinity(Integer g_a,double *nm)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  float *pfVar9;
  double *pdVar10;
  long lVar11;
  float fVar12;
  double dVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  bool bVar20;
  uint uVar21;
  ulong uVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  float fsum;
  int isum;
  Integer type;
  char *ptr;
  double dsum;
  long lsum;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  float fval;
  Integer ndim;
  Integer dims [7];
  _iterator_hdl hdl;
  long local_408;
  double *local_400;
  undefined1 local_3f0 [8];
  double *local_3e8;
  double local_3e0;
  double local_3d8;
  Integer local_3d0;
  double *local_3c8;
  double local_3c0;
  double local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_380;
  double local_378;
  long local_370;
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_3e8 = nm;
  pnga_nodeid();
  pnga_nnodes();
  iVar1 = _ga_sync_end;
  local_3f0._4_4_ = 0;
  local_3b8 = 0.0;
  local_3c0 = 0.0;
  local_3f0._0_4_ = 0.0;
  local_3c8 = (double *)0x0;
  local_3d8 = 0.0;
  local_3e0 = 0.0;
  _ga_sync_end = 1;
  bVar20 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  if (bVar20) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_norm_infinity_");
  pnga_inquire(g_a,&local_3d0,&local_370,local_368);
  if (local_370 - 3U < 0xfffffffffffffffe) {
    pnga_error("ga_norm_infinity: wrong dimension",local_370);
  }
  switch(local_3d0) {
  case 0x3e9:
    local_400 = (double *)(local_3f0 + 4);
    break;
  case 0x3ea:
    local_400 = &local_3b8;
    break;
  case 0x3eb:
    local_400 = (double *)local_3f0;
    break;
  case 0x3ec:
    local_400 = &local_3c0;
    break;
  default:
    pnga_error("ga_norm_infinity_: wrong data type:",local_3d0);
    local_400 = (double *)0x0;
    break;
  case 0x3ee:
    local_400 = &local_3e0;
    break;
  case 0x3ef:
    local_400 = &local_3d8;
  }
  pnga_local_iterator_init(g_a,&local_330);
  while (iVar3 = pnga_local_iterator_next
                           (&local_330,&local_398,&local_3a8,(char **)&local_3c8,&local_3b0),
        lVar6 = local_370, lVar2 = local_3b0, pdVar8 = local_3c8, iVar3 != 0) {
    lVar16 = local_3d0 + -0x3e9;
    local_380 = local_3d0;
    switch(lVar16) {
    case 0:
      pdVar7 = local_400;
      break;
    case 1:
      pdVar7 = (double *)0x0;
      pdVar17 = local_400;
      goto LAB_0012effd;
    case 2:
      pdVar7 = (double *)0x0;
      pdVar17 = (double *)0x0;
      pdVar18 = (double *)0x0;
      pdVar15 = local_400;
      goto LAB_0012f010;
    case 3:
      pdVar7 = (double *)0x0;
      pdVar17 = (double *)0x0;
      pdVar18 = local_400;
      goto LAB_0012f00d;
    default:
      pnga_error("ga_norm_infinity_: wrong data type:",local_3d0);
      pdVar7 = (double *)0x0;
      break;
    case 5:
      pdVar7 = (double *)0x0;
      pdVar17 = (double *)0x0;
      pdVar18 = (double *)0x0;
      pdVar15 = (double *)0x0;
      pdVar19 = (double *)0x0;
      pdVar10 = local_400;
      goto LAB_0012f015;
    case 6:
      pdVar7 = (double *)0x0;
      pdVar17 = (double *)0x0;
      pdVar18 = (double *)0x0;
      pdVar15 = (double *)0x0;
      pdVar19 = local_400;
      goto LAB_0012f013;
    }
    pdVar17 = (double *)0x0;
LAB_0012effd:
    pdVar18 = (double *)0x0;
LAB_0012f00d:
    pdVar15 = (double *)0x0;
LAB_0012f010:
    pdVar19 = (double *)0x0;
LAB_0012f013:
    pdVar10 = (double *)0x0;
LAB_0012f015:
    if (lVar6 < 1) {
LAB_0012f048:
      pnga_error("ga_norm_infinity: wrong dimension",lVar6);
      local_408 = 0;
      lVar4 = 0;
      lVar6 = 0;
      lVar14 = 0;
    }
    else {
      lVar4 = local_3a8;
      if (lVar6 == 2) {
        local_408 = local_398;
        lVar6 = local_3a0;
        lVar14 = local_390;
      }
      else {
        if (lVar6 != 1) goto LAB_0012f048;
        local_408 = local_398;
        lVar6 = 1;
        lVar14 = 1;
      }
    }
    if (0 < lVar6 && 0 < lVar4) {
      switch(lVar16) {
      case 0:
        fVar23 = *(float *)pdVar8;
        fVar5 = (float)-(int)fVar23;
        if (0 < (int)fVar23) {
          fVar5 = fVar23;
        }
        *(float *)pdVar7 = fVar5;
        if (lVar14 <= lVar6) {
          lVar16 = 0;
          do {
            if (local_408 <= lVar4) {
              fVar23 = *(float *)pdVar7;
              lVar11 = 0;
              do {
                fVar5 = *(float *)((long)pdVar8 + lVar11 * 4);
                fVar12 = (float)-(int)fVar5;
                if (0 < (int)fVar5) {
                  fVar12 = fVar5;
                }
                if ((int)fVar23 < (int)fVar12) {
                  *(float *)pdVar7 = fVar12;
                  fVar23 = fVar12;
                }
                lVar11 = lVar11 + 1;
              } while ((lVar4 - local_408) + 1 != lVar11);
            }
            lVar16 = lVar16 + 1;
            pdVar8 = (double *)((long)pdVar8 + lVar2 * 4);
          } while (lVar16 != (lVar6 - lVar14) + 1);
        }
        break;
      case 1:
        dVar24 = *pdVar8;
        dVar25 = (double)-(long)dVar24;
        if (0 < (long)dVar24) {
          dVar25 = dVar24;
        }
        *pdVar17 = dVar25;
        if (lVar14 <= lVar6) {
          lVar16 = 0;
          do {
            if (local_408 <= lVar4) {
              dVar24 = *pdVar17;
              lVar11 = 0;
              do {
                dVar25 = pdVar8[lVar11];
                dVar13 = (double)-(long)dVar25;
                if (0 < (long)dVar25) {
                  dVar13 = dVar25;
                }
                if ((long)dVar24 < (long)dVar13) {
                  *pdVar17 = dVar13;
                  dVar24 = dVar13;
                }
                lVar11 = lVar11 + 1;
              } while ((lVar4 - local_408) + 1 != lVar11);
            }
            lVar16 = lVar16 + 1;
            pdVar8 = pdVar8 + lVar2;
          } while (lVar16 != (lVar6 - lVar14) + 1);
        }
        break;
      case 2:
        *(float *)pdVar15 = *(float *)pdVar8;
        if (lVar14 <= lVar6) {
          lVar16 = 0;
          do {
            if (local_408 <= lVar4) {
              fVar23 = *(float *)pdVar15;
              lVar11 = 0;
              do {
                fVar5 = *(float *)((long)pdVar8 + lVar11 * 4);
                uVar21 = -(uint)(fVar5 < -fVar5);
                fVar5 = (float)(~uVar21 & (uint)fVar5 | (uint)-fVar5 & uVar21);
                if (fVar23 < fVar5) {
                  *(float *)pdVar15 = fVar5;
                  fVar23 = fVar5;
                }
                lVar11 = lVar11 + 1;
              } while ((lVar4 - local_408) + 1 != lVar11);
            }
            lVar16 = lVar16 + 1;
            pdVar8 = (double *)((long)pdVar8 + lVar2 * 4);
          } while (lVar16 != (lVar6 - lVar14) + 1);
        }
        break;
      case 3:
        *pdVar18 = *pdVar8;
        if (local_408 <= lVar4) {
          lVar16 = 0;
          do {
            if (lVar14 <= lVar6) {
              dVar24 = *pdVar18;
              pdVar7 = pdVar8;
              lVar11 = (lVar6 - lVar14) + 1;
              do {
                dVar25 = *pdVar7;
                dVar13 = (double)((ulong)dVar25 ^ (ulong)DAT_001b1350);
                uVar22 = -(ulong)(dVar25 < dVar13);
                dVar25 = (double)(~uVar22 & (ulong)dVar25 | (ulong)dVar13 & uVar22);
                if (dVar24 < dVar25) {
                  *pdVar18 = dVar25;
                  dVar24 = dVar25;
                }
                pdVar7 = pdVar7 + lVar2;
                lVar11 = lVar11 + -1;
              } while (lVar11 != 0);
            }
            lVar16 = lVar16 + 1;
            pdVar8 = pdVar8 + 1;
          } while (lVar16 != (lVar4 - local_408) + 1);
        }
        break;
      default:
        pnga_error("sgai_norm_infinity_block: wrong data type ",local_380);
        break;
      case 5:
        fVar23 = *(float *)pdVar8 * *(float *)pdVar8 +
                 *(float *)((long)pdVar8 + 4) * *(float *)((long)pdVar8 + 4);
        if (fVar23 < 0.0) {
          fVar23 = sqrtf(fVar23);
        }
        else {
          fVar23 = SQRT(fVar23);
        }
        *(float *)pdVar10 = fVar23;
        if (lVar14 <= lVar6) {
          pfVar9 = (float *)((long)pdVar8 + 4);
          lVar16 = 0;
          do {
            if (local_408 <= lVar4) {
              lVar11 = 0;
              do {
                fVar23 = pfVar9[lVar11 * 2 + -1] * pfVar9[lVar11 * 2 + -1] +
                         pfVar9[lVar11 * 2] * pfVar9[lVar11 * 2];
                if (fVar23 < 0.0) {
                  fVar23 = sqrtf(fVar23);
                }
                else {
                  fVar23 = SQRT(fVar23);
                }
                if (*(float *)pdVar10 <= fVar23 && fVar23 != *(float *)pdVar10) {
                  *(float *)pdVar10 = fVar23;
                }
                lVar11 = lVar11 + 1;
              } while ((lVar4 - local_408) + 1 != lVar11);
            }
            lVar16 = lVar16 + 1;
            pfVar9 = pfVar9 + lVar2 * 2;
          } while (lVar16 != (lVar6 - lVar14) + 1);
        }
        break;
      case 6:
        dVar24 = *pdVar8 * *pdVar8 + pdVar8[1] * pdVar8[1];
        if (dVar24 < 0.0) {
          dVar24 = sqrt(dVar24);
        }
        else {
          dVar24 = SQRT(dVar24);
        }
        *pdVar19 = dVar24;
        if (lVar14 <= lVar6) {
          pdVar8 = pdVar8 + 1;
          lVar16 = 0;
          do {
            lVar11 = (lVar4 - local_408) + 1;
            pdVar7 = pdVar8;
            if (local_408 <= lVar4) {
              do {
                dVar24 = pdVar7[-1] * pdVar7[-1] + *pdVar7 * *pdVar7;
                if (dVar24 < 0.0) {
                  dVar24 = sqrt(dVar24);
                }
                else {
                  dVar24 = SQRT(dVar24);
                }
                if (*pdVar19 <= dVar24 && dVar24 != *pdVar19) {
                  *pdVar19 = dVar24;
                }
                lVar11 = lVar11 + -1;
                pdVar7 = pdVar7 + 2;
              } while (lVar11 != 0);
            }
            lVar16 = lVar16 + 1;
            pdVar8 = pdVar8 + lVar2 * 2;
          } while (lVar16 != (lVar6 - lVar14) + 1);
        }
      }
    }
  }
  switch(local_3d0) {
  case 0x3e9:
    armci_msg_igop((int *)(local_3f0 + 4),1,"max");
    break;
  case 0x3ea:
    armci_msg_lgop((long *)&local_3b8,1,"max");
    break;
  case 0x3eb:
    armci_msg_fgop((float *)local_3f0,1,"max");
    break;
  case 0x3ec:
    armci_msg_dgop(&local_3c0,1,"max");
    break;
  default:
    pnga_error("ga_norm_infinity_: wrong data type ",local_3d0);
    break;
  case 0x3ee:
    local_378 = (double)CONCAT44(local_378._4_4_,local_3e0._0_4_);
    armci_msg_fgop((float *)&local_378,1,"max");
    local_3e0 = (double)CONCAT44(local_3e0._4_4_,local_378._0_4_);
    break;
  case 0x3ef:
    local_378 = local_3d8;
    armci_msg_dgop(&local_378,1,"max");
    local_3d8 = local_378;
  }
  switch(local_3d0) {
  case 0x3e9:
    dVar24 = (double)(int)local_3f0._4_4_;
    break;
  case 0x3ea:
    dVar24 = (double)(long)local_3b8;
    break;
  case 0x3eb:
    dVar24 = (double)(float)local_3f0._0_4_;
    break;
  case 0x3ec:
    dVar24 = local_3c0;
    break;
  default:
    pnga_error("ga_norm_infinity_:wrong data type.",local_3d0);
    goto LAB_0012f660;
  case 0x3ee:
    dVar24 = (double)local_3e0._0_4_;
    break;
  case 0x3ef:
    dVar24 = local_3d8;
  }
  *local_3e8 = dVar24;
LAB_0012f660:
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_norm_infinity(Integer g_a, double *nm)
{
  Integer type;
  Integer me = pnga_nodeid (), i, j, nproc = pnga_nnodes();
  Integer ndim, dims[MAXDIM], lo[2], hi[2], ld;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  int isum = 0;
  long lsum = 0;
  double dsum = 0.0;
  float fsum = 0.0;
  float fval;
  double dval;
  DoubleComplex zsum;
  SingleComplex csum;
  char *buf = NULL;
  char *ptr = NULL;
  zsum.real = 0.0;
  zsum.imag = 0.0;
  csum.real = 0.0;
  csum.imag = 0.0;
  _iterator_hdl hdl;


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_norm_infinity_");

  pnga_inquire (g_a, &type, &ndim, dims);

  if(ndim<=0)
    pnga_error("ga_norm_infinity: wrong dimension", ndim);
  else if (ndim >= 3)
    pnga_error("ga_norm_infinity: wrong dimension", ndim);


  switch (type)
  {
    case C_INT:
      buf = (void*)(&isum);
      break;
    case C_LONG:
      buf = (void*)(&lsum);
      break;
    case C_FLOAT:
      buf = (void*)(&fsum);
      break;
    case C_DBL:
      buf = (void*)(&dsum);
      break;
    case C_DCPL:
      buf = (void*)(&zsum);
      break;
    case C_SCPL:
      buf = (void*)(&csum);
      break;
    default:
      pnga_error("ga_norm_infinity_: wrong data type:", type);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld)) {
    sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, lo, hi);
    pnga_access_ptr(g_a, lo, hi, &ptr, &ld);
    sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
    pnga_release_update(g_a, lo, hi);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, lo, hi);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          lo[i] = index[i]*block_dims[i]+1;
          hi[i] = (index[i] + 1)*block_dims[i];
          if (hi[i] > dims[i]) hi[i] = dims[i];
          if (hi[i] < lo[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif


  /*calculate the global value buf[j] for each column */
  switch (type)
  {
    case C_INT:
      armci_msg_igop (&isum, 1, "max");
      break;
    case C_DBL:
      armci_msg_dgop (&dsum, 1, "max");
      break;
    case C_DCPL:
      dval = zsum.real;
      armci_msg_dgop (&dval, 1, "max");
      zsum.real = dval;
      break;
    case C_FLOAT:
      armci_msg_fgop (&fsum, 1, "max");
      break;
    case C_SCPL:
      fval = csum.real;
      armci_msg_fgop (&fval, 1, "max");
      csum.real = fval;
      break;
    case C_LONG:
      armci_msg_lgop (&lsum, 1, "max");
      break;
    default:
      pnga_error("ga_norm_infinity_: wrong data type ", type);
  }

  /*evaluate the norm infinity for the matrix g_a */
  switch (type)
  {
    case C_INT:
      *nm = (double)isum;
      break;
    case C_LONG:
      *nm = (double)lsum;
      break;
    case C_FLOAT:
      *nm = (double)fsum;
      break;
    case C_DBL:
      *nm = (double)dsum;
      break;
    case C_DCPL:
      *nm = (double)(zsum.real);
      break;
    case C_SCPL:
      *nm = (double)(csum.real);
      break;
    default:
      pnga_error("ga_norm_infinity_:wrong data type.", type);
  }

  if (local_sync_end)pnga_sync();
}